

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O0

bool __thiscall
ON_CurveProxy::GetCurveParameterFromNurbFormParameter
          (ON_CurveProxy *this,double nurbs_t,double *curve_t)

{
  ON_Curve *pOVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ON_ArcCurve *pOVar5;
  undefined4 extraout_var;
  double dVar6;
  ON_ArcCurve *arc_curve;
  ON_Curve *local_38;
  ON_Curve *tmp_real_crv;
  ON_Curve *real_crv;
  double *pdStack_20;
  bool rc;
  double *curve_t_local;
  double nurbs_t_local;
  ON_CurveProxy *this_local;
  
  real_crv._7_1_ = 0;
  if (this->m_real_curve != (ON_Curve *)0x0) {
    tmp_real_crv = this->m_real_curve;
    local_38 = (ON_Curve *)0x0;
    pdStack_20 = curve_t;
    curve_t_local = (double *)nurbs_t;
    nurbs_t_local = (double)this;
    (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    bVar2 = ON_Interval::operator!=(&this->m_real_curve_domain,(ON_Interval *)&arc_curve);
    if ((bVar2) &&
       (pOVar5 = ON_ArcCurve::Cast((ON_Object *)this->m_real_curve), pOVar5 != (ON_ArcCurve *)0x0))
    {
      iVar3 = (*(pOVar5->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x24])();
      local_38 = (ON_Curve *)CONCAT44(extraout_var,iVar3);
      if ((local_38 != (ON_Curve *)0x0) &&
         (uVar4 = (*(local_38->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                            (local_38,&this->m_real_curve_domain), (uVar4 & 1) != 0)) {
        tmp_real_crv = local_38;
      }
    }
    pOVar1 = tmp_real_crv;
    RealCurveParameter(this,(double)curve_t_local);
    uVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])(pOVar1,pdStack_20);
    real_crv._7_1_ = (byte)uVar4 & 1;
    if ((uVar4 & 1) != 0) {
      dVar6 = ThisCurveParameter(this,*pdStack_20);
      *pdStack_20 = dVar6;
    }
    if ((local_38 != (ON_Curve *)0x0) && (local_38 != (ON_Curve *)0x0)) {
      (*(local_38->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
  }
  return (bool)(real_crv._7_1_ & 1);
}

Assistant:

bool ON_CurveProxy::GetCurveParameterFromNurbFormParameter(
      double nurbs_t,
      double* curve_t
      ) const
{
  bool rc = false;
  if ( m_real_curve ) 
  {
    // 18 June 2003 Dale Lear and Chuck
    //     Fixing joining bug in STEP TEST 2 caused by error
    //     in converting NURBS parameter to arc parameter.
    const ON_Curve* real_crv = m_real_curve;

    ON_Curve* tmp_real_crv = 0;
    if ( m_real_curve_domain != m_real_curve->Domain() )
    {
      const ON_ArcCurve* arc_curve = ON_ArcCurve::Cast(m_real_curve);
      if ( 0 != arc_curve )
      {
        tmp_real_crv = arc_curve->DuplicateCurve();
        if ( 0 != tmp_real_crv )
        {
          if ( tmp_real_crv->Trim(m_real_curve_domain) )
          {
            real_crv = tmp_real_crv;
          }
        }
      }
    }

    rc = real_crv->GetCurveParameterFromNurbFormParameter( RealCurveParameter(nurbs_t),curve_t);
    if ( rc )
      *curve_t = ThisCurveParameter(*curve_t);

    if ( 0 != tmp_real_crv )
      delete tmp_real_crv;
  }
  return rc;
}